

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

int __thiscall
LPCMStreamReader::writeAdditionData
          (LPCMStreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  undefined4 *puVar6;
  uint uVar7;
  int iVar8;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  iVar8 = (int)dstBuffer;
  if (((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_demuxMode == true) &&
     (this->m_firstFrame == true)) {
    if (((int)dstEnd - iVar8 & 0xfffffff0U) < 0x30) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"LPCM stream error: Not enough buffer for writing headers",
                 0x38);
      puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar6 = 3;
      *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
      if (local_1b0 == &local_1a0) {
        puVar6[6] = local_1a0;
        puVar6[7] = uStack_19c;
        puVar6[8] = uStack_198;
        puVar6[9] = uStack_194;
      }
      else {
        *(uint **)(puVar6 + 2) = local_1b0;
        *(ulong *)(puVar6 + 6) = CONCAT44(uStack_19c,local_1a0);
      }
      *(undefined8 *)(puVar6 + 4) = local_1a8;
      local_1a0 = local_1a0 & 0xffffff00;
      __cxa_throw(puVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    dstBuffer[0] = 'R';
    dstBuffer[1] = 'I';
    dstBuffer[2] = 'F';
    dstBuffer[3] = 'F';
    dstBuffer[4] = -1;
    dstBuffer[5] = -1;
    dstBuffer[6] = -1;
    dstBuffer[7] = -1;
    dstBuffer[8] = 'W';
    dstBuffer[9] = 'A';
    dstBuffer[10] = 'V';
    dstBuffer[0xb] = 'E';
    dstBuffer[0xc] = 'f';
    dstBuffer[0xd] = 'm';
    dstBuffer[0xe] = 't';
    dstBuffer[0xf] = ' ';
    dstBuffer[0x10] = '(';
    dstBuffer[0x11] = '\0';
    dstBuffer[0x12] = '\0';
    dstBuffer[0x13] = '\0';
    dstBuffer[0x14] = 0xfe;
    dstBuffer[0x15] = 0xff;
    bVar1 = this->m_channels;
    *(ushort *)(dstBuffer + 0x16) = (ushort)bVar1;
    iVar3 = this->m_freq;
    *(int *)(dstBuffer + 0x18) = iVar3;
    uVar2 = this->m_bitsPerSample;
    *(uint *)(dstBuffer + 0x1c) = (uVar2 + 4 >> 3) * iVar3 * (uint)bVar1;
    uVar7 = 0x18;
    if (uVar2 != 0x14) {
      uVar7 = (uint)uVar2;
    }
    *(short *)(dstBuffer + 0x20) = (short)(uVar7 * bVar1 >> 3);
    *(short *)(dstBuffer + 0x22) = (short)uVar7;
    dstBuffer[0x24] = '\x16';
    dstBuffer[0x25] = '\0';
    *(ushort *)(dstBuffer + 0x26) = uVar2;
    uVar5 = wave_format::getWaveChannelMask((uint)this->m_channels,this->m_lfeExists);
    *(uint32_t *)(dstBuffer + 0x28) = uVar5;
    uVar4 = wave_format::KSDATAFORMAT_SUBTYPE_PCM._8_8_;
    *(undefined8 *)(dstBuffer + 0x2c) = wave_format::KSDATAFORMAT_SUBTYPE_PCM._0_8_;
    *(undefined8 *)(dstBuffer + 0x34) = uVar4;
    dstBuffer[0x3c] = 'd';
    dstBuffer[0x3d] = 'a';
    dstBuffer[0x3e] = 't';
    dstBuffer[0x3f] = 'a';
    dstBuffer[0x40] = 0xff;
    dstBuffer[0x41] = 0xff;
    dstBuffer[0x42] = 0xff;
    dstBuffer[0x43] = 0xff;
    dstBuffer[0x44] = '\0';
    dstBuffer = dstBuffer + 0x44;
  }
  this->m_firstFrame = false;
  return (int)dstBuffer - iVar8;
}

Assistant:

int LPCMStreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                        PriorityDataInfo* priorityData)
{
    uint8_t* curPos = dstBuffer;
    if (m_demuxMode)
    {
        if (m_firstFrame)
        {
            if (static_cast<unsigned>(dstEnd - dstBuffer) < sizeof(WAVEFORMATPCMEX) + 8)
                THROW(ERR_COMMON, "LPCM stream error: Not enough buffer for writing headers")
            // write wave header
            for (const char c : "RIFF\xff\xff\xff\xffWAVEfmt ") *curPos++ = c;
            curPos--;
            const auto fmtSize = reinterpret_cast<uint32_t*>(curPos);
            *fmtSize = sizeof(WAVEFORMATPCMEX);
            curPos += 4;
            const auto waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(curPos);
            waveFormatPCMEx->wFormatTag = WAVE_FORMAT_EXTENSIBLE;
            waveFormatPCMEx->nChannels = m_channels;
            waveFormatPCMEx->nSamplesPerSec = m_freq;
            waveFormatPCMEx->nAvgBytesPerSec = m_channels * m_freq * ((m_bitsPerSample + 4) >> 3);
            const uint16_t bitsPerSample = m_bitsPerSample == 20 ? 24 : m_bitsPerSample;
            waveFormatPCMEx->nBlockAlign = m_channels * bitsPerSample / 8;
            waveFormatPCMEx->wBitsPerSample = bitsPerSample;
            waveFormatPCMEx->cbSize = 22;  // After this to GUID
            waveFormatPCMEx->Samples.wValidBitsPerSample = m_bitsPerSample;
            waveFormatPCMEx->dwChannelMask = getWaveChannelMask(m_channels, m_lfeExists);  // Specify PCM
            waveFormatPCMEx->SubFormat = KSDATAFORMAT_SUBTYPE_PCM;
            curPos += sizeof(WAVEFORMATPCMEX);
            for (const char c : "data\xff\xff\xff\xff") *curPos++ = c;
            curPos--;
        }
    }
    /*
    if (m_headerType == htM2TS) {
            m_firstFrame = false;
            return curPos - dstBuffer; // frames already has right LPCM headers
    }
    */
    m_firstFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}